

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest18_19::initTest(FunctionalTest18_19 *this)

{
  GLuint *pGVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  GLuint GVar6;
  GLenum GVar7;
  GLint GVar8;
  undefined4 extraout_var;
  pointer __dest;
  TestError *this_00;
  uint n_varyings;
  size_type __dnew;
  string vs_body;
  char *varyings [1];
  uint local_dc;
  string local_d8;
  string local_b8;
  string local_98;
  char *local_78;
  string local_70;
  string local_50;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  local_78 = "result";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_d8._M_dataplus._M_p = (pointer)0x6af;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_d8);
  _Var3._M_p = local_d8._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_98._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 400\n\nsubroutine bool bool_processor();\nsubroutine vec4 vec4_processor(in vec4 iparam);\n\nsubroutine(bool_processor) bool returnsFalse()\n{\n    return false;\n}\n\nsubroutine(bool_processor) bool returnsTrue()\n{\n    return true;\n}\n\nsubroutine(vec4_processor) vec4 divideByTwo(in vec4 iparam)\n{\n    return iparam * vec4(0.5);\n}\n\nsubroutine(vec4_processor) vec4 multiplyByFour(in vec4 iparam)\n{\n    return iparam * vec4(4.0);\n}\n\nsubroutine uniform bool_processor bool_operator1;\nsubroutine uniform bool_processor bool_operator2;\nsubroutine uniform vec4_processor vec4_operator1;\nsubroutine uniform vec4_processor vec4_operator2;\n\nout float result;\n\nvoid main()\n{\n    if (bool_operator1() )\n    {\n        float value = float( (3 * gl_VertexID + 1) * 2);\n\n        while (bool_operator1() )\n        {\n            value /= float(gl_VertexID + 2);\n\n            if (value <= 1.0f) break;\n        }\n\n        result = value;\n    }\n    else\n    {\n        vec4 value = vec4(gl_VertexID,     gl_VertexID + 1,\n                          gl_VertexID + 2, gl_VertexID + 3);\n\n        switch (gl_VertexID % 2)\n        {\n            case 0:\n            {\n                for (int iteration = 0; iteration < gl_VertexID && bool_operator2(); ++iteration)\n                {\n                    value = vec4_operator2(vec4_operator1(value));\n                }\n\n                break;\n            }\n\n            case 1:\n            {\n                for (int iteration = 0; iteration < gl_VertexID * 2; ++iteration)\n                {\n                    value = vec4_operator1(vec4_operator2(value));\n                }\n\n                break;\n            }\n        }\n\n        result = value.x + value.y + value.z + value.w;\n\n    }\n}\n"
         ,0x6af);
  local_98._M_string_length = (size_type)_Var3._M_p;
  __dest[_Var3._M_p] = '\0';
  local_dc = 1;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,0x1b32ab9);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,0x1b32ab9);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,0x1b32ab9);
  pGVar1 = &this->m_po_id;
  bVar4 = Utils::buildProgram(gl,&local_98,&local_d8,&local_50,&local_b8,&local_70,&local_78,
                              &local_dc,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,
                              (GLuint *)0x0,pGVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    GVar6 = (*gl->getSubroutineIndex)(*pGVar1,0x8b31,"divideByTwo");
    this->m_po_subroutine_divide_by_two_location = GVar6;
    GVar6 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"multiplyByFour");
    this->m_po_subroutine_multiply_by_four_location = GVar6;
    GVar6 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsFalse");
    this->m_po_subroutine_returns_false_location = GVar6;
    GVar6 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsTrue");
    this->m_po_subroutine_returns_true_location = GVar6;
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"glGetSubroutineIndex() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x257f);
    if ((((this->m_po_subroutine_divide_by_two_location == 0xffffffff) ||
         (this->m_po_subroutine_multiply_by_four_location == 0xffffffff)) ||
        (this->m_po_subroutine_returns_false_location == 0xffffffff)) ||
       (this->m_po_subroutine_returns_true_location == 0xffffffff)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2586);
    }
    else {
      GVar8 = (*gl->getSubroutineUniformLocation)(*pGVar1,0x8b31,"bool_operator1");
      this->m_po_subroutine_uniform_bool_operator1 = GVar8;
      GVar8 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"bool_operator2");
      this->m_po_subroutine_uniform_bool_operator2 = GVar8;
      GVar8 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator1");
      this->m_po_subroutine_uniform_vec4_processor1 = GVar8;
      GVar8 = (*gl->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator2");
      this->m_po_subroutine_uniform_vec4_processor2 = GVar8;
      GVar7 = (*gl->getError)();
      glu::checkError(GVar7,"glGetSubroutineUniformLocation() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2591);
      if (((this->m_po_subroutine_uniform_bool_operator1 != -1) &&
          (this->m_po_subroutine_uniform_bool_operator2 != -1)) &&
         ((this->m_po_subroutine_uniform_vec4_processor1 != -1 &&
          (this->m_po_subroutine_uniform_vec4_processor2 != -1)))) {
        uVar2 = this->m_n_points_to_draw;
        pGVar1 = &this->m_xfb_bo_id;
        (*gl->genBuffers)(1,pGVar1);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glGenBuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x259d);
        (*gl->bindBuffer)(0x8c8e,*pGVar1);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a0);
        (*gl->bindBufferBase)(0x8c8e,0,*pGVar1);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glBindBufferBase() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a3);
        (*gl->bufferData)(0x8c8e,(ulong)(uVar2 << 2),(void *)0x0,0x88e6);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25a6);
        (*gl->genVertexArrays)(1,&this->m_vao_id);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25aa);
        (*gl->bindVertexArray)(this->m_vao_id);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x25ad);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          (ulong)(local_98.field_2._M_allocated_capacity + 1));
        }
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2596);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to build test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2577);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest18_19::initTest()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const char*			  varyings[1] = { "result" };
	std::string			  vs_body	 = getVertexShaderBody();
	const unsigned int	n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	if (!Utils::buildProgram(gl, vs_body, "",						  /* tc_body */
							 "",									  /* te_body */
							 "",									  /* gs_body */
							 "",									  /* fs_body */
							 varyings, n_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,								  /* out_te_id */
							 DE_NULL,								  /* out_gs_id */
							 DE_NULL,								  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Failed to build test program object");
	}

	/* Retrieve subroutine & subroutine uniform locations */
	m_po_subroutine_divide_by_two_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "divideByTwo");
	m_po_subroutine_multiply_by_four_location = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "multiplyByFour");
	m_po_subroutine_returns_false_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsFalse");
	m_po_subroutine_returns_true_location	 = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsTrue");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed");

	if (m_po_subroutine_divide_by_two_location == GL_INVALID_INDEX ||
		m_po_subroutine_multiply_by_four_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_false_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_true_location == GL_INVALID_INDEX)
	{
		TCU_FAIL("glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine");
	}

	m_po_subroutine_uniform_bool_operator1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator1");
	m_po_subroutine_uniform_bool_operator2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator2");
	m_po_subroutine_uniform_vec4_processor1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator1");
	m_po_subroutine_uniform_vec4_processor2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator2");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed");

	if (m_po_subroutine_uniform_bool_operator1 == -1 || m_po_subroutine_uniform_bool_operator2 == -1 ||
		m_po_subroutine_uniform_vec4_processor1 == -1 || m_po_subroutine_uniform_vec4_processor2 == -1)
	{
		TCU_FAIL("glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform");
	}

	/* Set up XFB BO */
	const unsigned int bo_size = static_cast<unsigned int>(sizeof(float) * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL /* data */, GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Set up a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}